

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O1

void EBPLM::PredictVelOnYFace
               (Box *yebox,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  BCRec *bcrec;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  double *pdVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  double *pdVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  EBCellFlag *pEVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  double *pdVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  double *pdVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  double *pdVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  undefined8 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  int iVar83;
  int iVar84;
  pair<bool,_bool> pVar85;
  pair<bool,_bool> pVar86;
  pair<bool,_bool> pVar87;
  int kk;
  int iVar88;
  int iVar89;
  int iVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  double **ppdVar103;
  double *pdVar104;
  Long *pLVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  char cVar119;
  int dir;
  int dir_00;
  uint uVar120;
  int iVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  double *pdVar128;
  int iVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  int jj;
  long lVar134;
  long lVar135;
  long lVar136;
  int iVar137;
  int iVar138;
  uint uVar139;
  uint uVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  long lVar144;
  double *pdVar145;
  double *pdVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  long lVar155;
  double *pdVar156;
  double *pdVar157;
  char cVar158;
  long lVar159;
  int iVar160;
  int iVar161;
  long lVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  int iVar169;
  long lVar170;
  long lVar171;
  int iVar172;
  long lVar173;
  long lVar174;
  int cuts_x;
  int iVar175;
  int iVar176;
  long lVar177;
  long lVar178;
  long lVar179;
  bool bVar180;
  ulong uVar181;
  double dVar182;
  double dVar183;
  undefined1 auVar188 [16];
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar191;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar198;
  undefined1 auVar197 [16];
  double dVar199;
  undefined4 uVar200;
  undefined4 uVar201;
  undefined4 uVar202;
  undefined4 uVar203;
  ulong uVar204;
  double dVar205;
  undefined1 auVar206 [16];
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar214;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  Real delta_z;
  Real delta_x;
  Real du [27];
  Real A [27] [3];
  double local_aa8;
  double local_a38;
  double local_a28;
  long local_918;
  long local_910;
  long local_900;
  double *local_888;
  double *local_880;
  double *local_878;
  double *local_7d8;
  double *local_7d0;
  double *local_7c8;
  double *local_738;
  double *local_730;
  double *local_728;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  double adStack_3b8 [28];
  anon_class_680_18_513cbdb0 local_2d8;
  
  dVar182 = dt / (geom->super_CoordSys).dx[1];
  iVar172 = (geom->domain).smallend.vect[0];
  iVar175 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar161 = (geom->domain).bigend.vect[0];
  iVar6 = (geom->domain).bigend.vect[1];
  pVar85 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,0,(int)Ipy);
  pVar86 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,1,dir);
  iVar7 = (geom->domain).smallend.vect[2];
  iVar8 = (geom->domain).bigend.vect[2];
  pVar87 = anon_unknown.dwarf_65c5ee::has_extdir_or_ho(bcrec,2,dir_00);
  if (((((((ushort)pVar85 & 1) == 0) || (iVar172 < (yebox->smallend).vect[0] + -1)) &&
       ((((ushort)pVar85 >> 8 & 1) == 0 || ((yebox->bigend).vect[0] < iVar161)))) &&
      (((((ushort)pVar87 & 1) == 0 || (iVar7 < (yebox->smallend).vect[2] + -1)) &&
       ((((ushort)pVar87 >> 8 & 1) == 0 || ((yebox->bigend).vect[2] < iVar8)))))) &&
     (((((ushort)pVar86 & 1) == 0 || (iVar175 < (yebox->smallend).vect[1] + -1)) &&
      ((((ushort)pVar86 >> 8 & 1) == 0 || ((yebox->bigend).vect[1] < iVar6)))))) {
    lVar32 = ccc->jstride;
    iVar172 = (ccc->begin).y;
    iVar175 = (yebox->smallend).vect[1];
    lVar91 = (~(long)iVar172 + (long)iVar175) * lVar32;
    iVar161 = (ccc->begin).z;
    iVar6 = (yebox->smallend).vect[2];
    lVar33 = ccc->kstride;
    lVar110 = (~(long)iVar161 + (long)iVar6) * lVar33;
    lVar34 = ccc->nstride;
    iVar7 = (yebox->smallend).vect[0];
    lVar159 = (long)iVar7;
    iVar8 = (ccc->begin).x;
    lVar92 = (long)iVar8;
    pdVar35 = q->p;
    lVar36 = q->jstride;
    lVar37 = q->kstride;
    lVar38 = q->nstride;
    iVar9 = (q->begin).x;
    lVar148 = (long)iVar9;
    iVar10 = (q->begin).y;
    lVar130 = (long)iVar10;
    iVar11 = (q->begin).z;
    lVar131 = (long)iVar11;
    pdVar39 = ccvel->p;
    lVar40 = ccvel->jstride;
    lVar41 = ccvel->kstride;
    lVar42 = ccvel->nstride;
    lVar177 = (long)(ccvel->begin).x;
    lVar178 = (long)(ccvel->begin).y;
    iVar12 = (ccvel->begin).z;
    pdVar43 = Imy->p;
    lVar44 = Imy->jstride;
    lVar45 = Imy->kstride;
    lVar46 = Imy->nstride;
    iVar13 = (Imy->begin).x;
    iVar14 = (Imy->begin).y;
    iVar129 = (Imy->begin).z;
    pdVar47 = Ipy->p;
    lVar48 = Ipy->jstride;
    lVar49 = Ipy->kstride;
    lVar50 = Ipy->nstride;
    iVar15 = (Ipy->begin).x;
    uVar16 = (Ipy->begin).y;
    iVar17 = (Ipy->begin).z;
    pEVar51 = flag->p;
    lVar52 = flag->jstride;
    lVar53 = flag->kstride;
    iVar18 = (flag->begin).x;
    lVar162 = (long)(flag->begin).y;
    iVar19 = (flag->begin).z;
    pdVar54 = vfrac->p;
    lVar55 = vfrac->jstride;
    lVar56 = vfrac->kstride;
    uVar20 = (vfrac->begin).x;
    lVar170 = (long)(int)uVar20;
    iVar21 = (vfrac->begin).y;
    lVar163 = (long)iVar21;
    uVar22 = (vfrac->begin).z;
    lVar134 = (long)(int)uVar22;
    pdVar57 = ccc->p;
    pdVar58 = fcx->p;
    lVar59 = fcx->jstride;
    lVar60 = fcx->kstride;
    lVar61 = fcx->nstride;
    iVar23 = (fcx->begin).x;
    lVar164 = (long)(fcx->begin).y;
    iVar24 = (fcx->begin).z;
    pdVar62 = fcy->p;
    lVar63 = fcy->jstride;
    lVar64 = fcy->kstride;
    lVar65 = fcy->nstride;
    lVar165 = (long)(fcy->begin).x;
    iVar25 = (fcy->begin).y;
    iVar26 = (fcy->begin).z;
    pdVar66 = fcz->p;
    lVar67 = fcz->jstride;
    lVar68 = fcz->kstride;
    lVar69 = fcz->nstride;
    lVar166 = (long)(fcz->begin).x;
    lVar167 = (long)(fcz->begin).y;
    iVar27 = (fcz->begin).z;
    iVar28 = (yebox->bigend).vect[0];
    iVar29 = (yebox->bigend).vect[1];
    iVar30 = (yebox->bigend).vect[2];
    local_918 = 0;
    auVar213 = _DAT_0077bb40;
    auVar190 = _DAT_0077bb30;
    do {
      if (iVar6 <= iVar30) {
        lVar111 = local_918 * lVar38;
        local_910 = (long)iVar6;
        local_888 = pdVar57 + ((lVar34 * 2 + lVar159 + lVar91 + lVar110 + -1) - lVar92);
        local_880 = pdVar57 + ((lVar34 + lVar159 + lVar91 + lVar110 + -1) - lVar92);
        local_878 = pdVar57 + ((lVar159 + lVar91 + lVar110 + -1) - lVar92);
        do {
          if (iVar175 <= iVar29) {
            lVar93 = (local_910 - iVar19) * lVar53;
            lVar179 = (local_910 - lVar134) * lVar56;
            lVar168 = (local_910 - lVar131) * lVar37;
            lVar171 = (local_910 - iVar12) * lVar41;
            lVar135 = (local_910 - iVar26) * lVar64;
            lVar94 = (local_910 - iVar161) * lVar33;
            iVar160 = (int)local_910;
            iVar88 = iVar160 - iVar11;
            lVar95 = iVar88 * lVar37;
            lVar96 = ((local_910 + -1) - lVar134) * lVar56;
            lVar97 = ((local_910 + 1) - lVar134) * lVar56;
            lVar132 = ((local_910 + -1) - lVar131) * lVar37;
            lVar173 = ((local_910 + 1) - lVar131) * lVar37;
            lVar98 = (local_910 - iVar24) * lVar60;
            lVar133 = ((iVar160 + 1) - iVar27) * lVar68;
            lVar174 = (local_910 - iVar27) * lVar68;
            lVar112 = (int)(~uVar22 + iVar160) * lVar56;
            lVar99 = (int)((iVar160 + 1) - uVar22) * lVar56;
            local_7c8 = local_878;
            local_7d0 = local_880;
            local_7d8 = local_888;
            local_900 = (long)iVar175;
            do {
              if (iVar7 <= iVar28) {
                lVar100 = (local_900 - lVar163) * lVar55;
                lVar2 = local_900 + -1;
                lVar113 = (lVar2 - lVar163) * lVar55;
                lVar3 = local_900 + -2;
                lVar114 = (lVar3 - lVar163) * lVar55;
                lVar4 = local_900 + 1;
                lVar122 = (lVar4 - lVar163) * lVar55;
                lVar123 = (local_900 - lVar130) * lVar36;
                lVar141 = (local_900 - lVar178) * lVar40;
                lVar142 = (lVar2 - lVar130) * lVar36;
                lVar143 = (lVar4 - lVar130) * lVar36;
                lVar144 = (lVar3 - lVar130) * lVar36;
                lVar149 = (local_900 - iVar25) * lVar63;
                lVar150 = (local_900 - iVar172) * lVar32;
                iVar137 = (int)local_900;
                iVar138 = iVar137 - iVar10;
                lVar151 = iVar138 * lVar36;
                lVar154 = (local_900 - lVar164) * lVar59;
                lVar155 = (local_900 - lVar167) * lVar67;
                lVar124 = (lVar2 - lVar178) * lVar40;
                lVar125 = ((int)lVar3 - iVar10) * lVar36;
                iVar106 = (int)lVar2 - iVar172;
                iVar107 = (int)lVar2 - iVar10;
                lVar115 = iVar107 * lVar36;
                lVar116 = (lVar2 - lVar164) * lVar59;
                lVar101 = (lVar2 - lVar167) * lVar67;
                local_728 = local_7c8;
                local_730 = local_7d0;
                local_738 = local_7d8;
                lVar147 = lVar159;
                iVar5 = iVar7 - iVar9;
                iVar83 = (iVar7 + -1) - iVar9;
                iVar84 = (iVar7 + -1) - iVar8;
                do {
                  lVar117 = lVar147 - iVar18;
                  uVar31 = pEVar51[lVar93 + (local_900 - lVar162) * lVar52 + lVar117].flag;
                  local_a28 = 0.0;
                  dVar185 = 0.0;
                  if ((short)uVar31 < 0) {
                    lVar152 = lVar147 - lVar170;
                    dVar208 = pdVar54[lVar100 + lVar152 + lVar179];
                    iVar89 = (int)lVar147;
                    if ((((dVar208 != 1.0) || (NAN(dVar208))) ||
                        (pdVar54[lVar113 + lVar179 + lVar152] != 1.0)) ||
                       (NAN(pdVar54[lVar113 + lVar179 + lVar152]))) {
LAB_004115ec:
                      lVar126 = lVar147 - lVar165;
                      dVar185 = pdVar62[lVar149 + lVar135 + lVar126];
                      dVar187 = pdVar62[lVar149 + lVar135 + lVar126 + lVar65];
                      lVar102 = lVar147 - lVar92;
                      dVar196 = pdVar57[lVar94 + lVar150 + lVar102 + lVar34];
                      dVar216 = pdVar57[lVar94 + lVar150 + lVar102];
                      dVar209 = pdVar57[lVar94 + lVar150 + lVar102 + lVar34 * 2];
                      lVar127 = (long)(iVar89 - iVar9);
                      dVar186 = pdVar35[lVar151 + lVar127 + lVar95 + lVar111];
                      dVar219 = pdVar35[lVar142 + lVar95 + lVar111 + lVar127];
                      lVar118 = -1;
                      cVar119 = '\x05';
                      lVar153 = 0;
                      pdVar104 = local_728;
                      pdVar145 = local_738;
                      pdVar156 = local_730;
                      do {
                        lVar136 = -1;
                        pdVar128 = pdVar104;
                        pdVar146 = pdVar145;
                        pdVar157 = pdVar156;
                        cVar158 = cVar119;
                        do {
                          iVar121 = (int)lVar153;
                          ppdVar103 = &local_2d8.q.p + (long)iVar121 * 3;
                          lVar153 = 0;
                          do {
                            if (((int)lVar153 == 1 && ((int)lVar136 == 0 && (int)lVar118 == 0)) ||
                               ((1 << ((char)lVar153 + cVar158 & 0x1fU) & uVar31) == 0)) {
                              *ppdVar103 = (double *)0x0;
                              ppdVar103[1] = (double *)0x0;
                              ppdVar103[2] = (double *)0x0;
                            }
                            else {
                              auVar206._0_8_ =
                                   (pdVar128[lVar153] + (double)((int)lVar153 + -1)) - dVar216;
                              auVar206._8_8_ = (pdVar157[lVar153] + (double)(int)lVar136) - dVar196;
                              *(undefined1 (*) [16])ppdVar103 = auVar206;
                              ppdVar103[2] = (double *)
                                             ((pdVar146[lVar153] + (double)(int)lVar118) -
                                             pdVar57[lVar94 + lVar150 + lVar102 + lVar34 * 2]);
                            }
                            lVar153 = lVar153 + 1;
                            ppdVar103 = ppdVar103 + 3;
                          } while (lVar153 != 3);
                          lVar136 = lVar136 + 1;
                          pdVar146 = pdVar146 + lVar32;
                          pdVar157 = pdVar157 + lVar32;
                          pdVar128 = pdVar128 + lVar32;
                          cVar158 = cVar158 + '\x03';
                          lVar153 = (long)iVar121 + 3;
                        } while (lVar136 != 2);
                        lVar118 = lVar118 + 1;
                        pdVar145 = pdVar145 + lVar33;
                        pdVar156 = pdVar156 + lVar33;
                        pdVar104 = pdVar104 + lVar33;
                        cVar119 = cVar119 + '\t';
                        lVar153 = (long)iVar121 + 3;
                      } while (lVar118 != 2);
                      lVar102 = -1;
                      cVar119 = '\x05';
                      lVar118 = 0;
                      do {
                        lVar153 = -1;
                        cVar158 = cVar119;
                        do {
                          iVar121 = (int)lVar118;
                          lVar118 = 0;
                          do {
                            dVar183 = 0.0;
                            if (((int)lVar118 != 1 || ((int)lVar153 != 0 || (int)lVar102 != 0)) &&
                               ((1 << (cVar158 + (char)lVar118 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                          (iVar138 + (int)lVar153) * lVar36 +
                                                          (long)(iVar83 + (int)lVar118)] - dVar186;
                            }
                            adStack_3b8[iVar121 + lVar118] = dVar183;
                            lVar118 = lVar118 + 1;
                          } while (lVar118 != 3);
                          lVar153 = lVar153 + 1;
                          cVar158 = cVar158 + '\x03';
                          lVar118 = (long)iVar121 + 3;
                        } while (lVar153 != 2);
                        lVar102 = lVar102 + 1;
                        cVar119 = cVar119 + '\t';
                        lVar118 = (long)iVar121 + 3;
                      } while (lVar102 != 2);
                      pdVar104 = &local_408;
                      lVar102 = 0;
                      do {
                        lVar118 = 0;
                        auVar188 = auVar190;
                        do {
                          if (SUB164(auVar188 ^ auVar213,4) == -0x80000000 &&
                              SUB164(auVar188 ^ auVar213,0) < -0x7ffffffd) {
                            *(undefined8 *)((long)pdVar104 + lVar118) = 0;
                            *(undefined8 *)((long)pdVar104 + lVar118 + 0x18) = 0;
                          }
                          lVar153 = auVar188._8_8_;
                          auVar188._0_8_ = auVar188._0_8_ + 2;
                          auVar188._8_8_ = lVar153 + 2;
                          lVar118 = lVar118 + 0x30;
                        } while (lVar118 != 0x60);
                        lVar102 = lVar102 + 1;
                        pdVar104 = pdVar104 + 1;
                      } while (lVar102 != 3);
                      dVar191 = 0.0;
                      dVar214 = 0.0;
                      dVar221 = 0.0;
                      pLVar105 = &local_2d8.q.kstride;
                      lVar102 = 0;
                      dVar184 = local_408;
                      dVar207 = local_400;
                      dVar183 = local_3c8;
                      dVar192 = local_3e8;
                      dVar193 = dStack_3e0;
                      dVar220 = local_3f8;
                      do {
                        dVar205 = (double)*pLVar105;
                        pdVar104 = ((Array4<const_double> *)(pLVar105 + -2))->p;
                        dVar222 = (double)pLVar105[-1];
                        dVar192 = dVar192 + dVar222 * (double)pLVar105[-1];
                        dVar193 = dVar193 + dVar222 * (double)*pLVar105;
                        dVar183 = dVar183 + dVar205 * dVar205;
                        dVar194 = adStack_3b8[lVar102];
                        dVar184 = dVar184 + (double)pdVar104 * (double)pdVar104;
                        dVar191 = dVar191 + dVar194 * (double)pdVar104;
                        dVar207 = dVar207 + dVar222 * (double)pdVar104;
                        dVar214 = dVar214 + dVar194 * dVar222;
                        dVar220 = dVar220 + dVar205 * (double)pdVar104;
                        dVar221 = dVar221 + dVar194 * dVar205;
                        lVar102 = lVar102 + 1;
                        pLVar105 = pLVar105 + 3;
                      } while (lVar102 != 0x1b);
                      dVar194 = dVar192 * dVar183 - dVar193 * dVar193;
                      dVar205 = dVar183 * dVar207 - dVar220 * dVar193;
                      dVar183 = dVar183 * dVar214 - dVar221 * dVar193;
                      dVar218 = dVar207 * dVar193 - dVar192 * dVar220;
                      dVar222 = dVar220 * dVar218 + (dVar194 * dVar184 - dVar207 * dVar205);
                      dVar194 = (dVar220 * (dVar214 * dVar193 - dVar192 * dVar221) +
                                (dVar194 * dVar191 - dVar207 * dVar183)) / dVar222;
                      if ((dVar208 == 1.0) && (!NAN(dVar208))) {
                        if ((pdVar54[lVar100 + lVar179 + ((lVar147 + -1) - lVar170)] == 1.0) &&
                           (!NAN(pdVar54[lVar100 + lVar179 + ((lVar147 + -1) - lVar170)]))) {
                          if ((pdVar54[lVar100 + lVar179 + ((lVar147 + 1) - lVar170)] == 1.0) &&
                             (!NAN(pdVar54[lVar100 + lVar179 + ((lVar147 + 1) - lVar170)]))) {
                            dVar195 = dVar186 - pdVar35[lVar151 + lVar95 + lVar111 + ((lVar147 + -1)
                                                                                     - lVar148)];
                            dVar198 = pdVar35[lVar151 + lVar95 + lVar111 + ((lVar147 + 1) - lVar148)
                                             ] - dVar186;
                            dVar195 = dVar195 + dVar195;
                            dVar198 = dVar198 + dVar198;
                            dVar194 = (pdVar35[lVar151 + lVar95 + lVar111 + ((lVar147 + 1) - lVar148
                                                                            )] -
                                      pdVar35[lVar151 + lVar95 + lVar111 + ((lVar147 + -1) - lVar148
                                                                           )]) * 0.5;
                            dVar199 = ABS(dVar195);
                            uVar181 = -(ulong)(0.0 < dVar194);
                            dVar194 = ABS(dVar194);
                            dVar215 = ABS(dVar198);
                            if (dVar199 <= dVar194) {
                              dVar194 = dVar199;
                            }
                            if (dVar194 <= dVar215) {
                              dVar215 = dVar194;
                            }
                            uVar204 = -(ulong)(0.0 < dVar195 * dVar198) & (ulong)dVar215;
                            dVar194 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                              uVar181 & uVar204);
                          }
                        }
                      }
                      dVar215 = dVar207 * dVar221 - dVar220 * dVar214;
                      local_aa8 = (dVar220 * dVar215 + (dVar183 * dVar184 - dVar205 * dVar191)) /
                                  dVar222;
                      if ((((dVar208 == 1.0) && (!NAN(dVar208))) &&
                          (pdVar54[lVar113 + lVar179 + lVar152] == 1.0)) &&
                         (((!NAN(pdVar54[lVar113 + lVar179 + lVar152]) &&
                           (pdVar54[lVar179 + lVar122 + lVar152] == 1.0)) &&
                          (!NAN(pdVar54[lVar179 + lVar122 + lVar152]))))) {
                        dVar195 = pdVar35[lVar143 + lVar95 + lVar111 + lVar127] - dVar186;
                        dVar205 = (dVar186 - dVar219) + (dVar186 - dVar219);
                        dVar195 = dVar195 + dVar195;
                        dVar183 = (pdVar35[lVar143 + lVar95 + lVar111 + lVar127] - dVar219) * 0.5;
                        dVar198 = ABS(dVar205);
                        uVar181 = -(ulong)(0.0 < dVar183);
                        dVar183 = ABS(dVar183);
                        dVar220 = ABS(dVar195);
                        if (dVar198 <= dVar183) {
                          dVar183 = dVar198;
                        }
                        if (dVar183 <= dVar220) {
                          dVar220 = dVar183;
                        }
                        uVar204 = -(ulong)(0.0 < dVar205 * dVar195) & (ulong)dVar220;
                        local_aa8 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                            uVar181 & uVar204);
                      }
                      dVar222 = (dVar191 * dVar218 +
                                (dVar184 * (dVar192 * dVar221 - dVar193 * dVar214) -
                                dVar215 * dVar207)) / dVar222;
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         ((pdVar54[lVar100 + lVar152 + lVar96] == 1.0 &&
                          (((!NAN(pdVar54[lVar100 + lVar152 + lVar96]) &&
                            (pdVar54[lVar100 + lVar152 + lVar97] == 1.0)) &&
                           (!NAN(pdVar54[lVar100 + lVar152 + lVar97]))))))) {
                        dVar192 = dVar186 - pdVar35[lVar151 + lVar127 + lVar132 + lVar111];
                        dVar193 = pdVar35[lVar151 + lVar127 + lVar173 + lVar111] - dVar186;
                        dVar192 = dVar192 + dVar192;
                        dVar193 = dVar193 + dVar193;
                        dVar184 = (pdVar35[lVar151 + lVar127 + lVar173 + lVar111] -
                                  pdVar35[lVar151 + lVar127 + lVar132 + lVar111]) * 0.5;
                        dVar207 = ABS(dVar192);
                        uVar181 = -(ulong)(0.0 < dVar184);
                        dVar184 = ABS(dVar184);
                        dVar183 = ABS(dVar193);
                        if (dVar207 <= dVar184) {
                          dVar184 = dVar207;
                        }
                        if (dVar184 <= dVar183) {
                          dVar183 = dVar184;
                        }
                        uVar204 = -(ulong)(0.0 < dVar192 * dVar193) & (ulong)dVar183;
                        dVar222 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                          uVar181 & uVar204);
                      }
                      dVar183 = dVar219;
                      if (dVar186 <= dVar219) {
                        dVar183 = dVar186;
                      }
                      if (dVar219 <= dVar186) {
                        dVar219 = dVar186;
                      }
                      iVar109 = 0;
                      iVar176 = 0;
                      iVar90 = 0;
                      iVar121 = 0;
                      uVar120 = 0xffffffff;
                      do {
                        uVar139 = uVar120 + 1;
                        uVar140 = 0xffffffff;
                        iVar169 = iVar109;
                        do {
                          uVar1 = uVar140 + 1;
                          iVar108 = 5;
                          do {
                            if (((uVar31 >> (iVar108 + iVar169 & 0x1fU) & 1) != 0) &&
                               ((iVar108 != 6 || uVar140 != 0) || uVar120 != 0)) {
                              iVar176 = iVar176 + (uint)((iVar108 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar140 == 0 && uVar120 == 0));
                              iVar90 = iVar90 + (uint)((iVar108 == 6 && uVar120 == 0) &&
                                                      (uVar1 & 0xfffffffd) == 0);
                              iVar121 = iVar121 + (uint)((iVar108 == 6 && uVar140 == 0) &&
                                                        (uVar139 & 0xfffffffd) == 0);
                            }
                            iVar108 = iVar108 + 1;
                          } while (iVar108 != 8);
                          iVar169 = iVar169 + 3;
                          uVar140 = uVar1;
                        } while (uVar1 != 2);
                        iVar109 = iVar109 + 9;
                        uVar120 = uVar139;
                      } while (uVar139 != 2);
                      dVar184 = 2.0;
                      if ((uVar31 >> 0x15 & 1) != 0) {
                        lVar102 = -1;
                        cVar119 = '\b';
                        dVar207 = dVar186;
                        dVar184 = dVar186;
                        do {
                          lVar118 = 0;
                          cVar158 = cVar119;
                          do {
                            lVar127 = 0;
                            dVar192 = dVar184;
                            do {
                              dVar184 = dVar192;
                              if (((int)lVar127 != 1 || ((int)lVar118 != 0 || (int)lVar102 != 0)) &&
                                 ((1 << (cVar158 + (char)lVar127 & 0x1fU) & uVar31) != 0)) {
                                dVar193 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                            (iVar138 + (int)lVar118) * lVar36 +
                                                            (long)(iVar83 + (int)lVar127)];
                                dVar184 = dVar193;
                                if (dVar193 <= dVar192) {
                                  dVar184 = dVar192;
                                }
                                if (dVar193 < dVar207) {
                                  dVar207 = dVar193;
                                }
                              }
                              lVar127 = lVar127 + 1;
                              dVar192 = dVar184;
                            } while (lVar127 != 3);
                            cVar158 = cVar158 + '\x03';
                            bVar180 = lVar118 == 0;
                            lVar118 = lVar118 + 1;
                          } while (bVar180);
                          lVar102 = lVar102 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar102 != 2);
                        dVar192 = (((pdVar62 + lVar135 + ((iVar137 + 1) - iVar25) * lVar63 + lVar126
                                    )[lVar65] - dVar209) * dVar222 +
                                  (0.5 - dVar196) * local_aa8 +
                                  (pdVar62[lVar135 + ((iVar137 + 1) - iVar25) * lVar63 + lVar126] -
                                  dVar216) * dVar194 + dVar186) - dVar186;
                        if (dVar192 <= 1e-13) {
                          dVar184 = 1.0;
                          if ((dVar192 < -1e-13) &&
                             (dVar184 = (dVar207 - dVar186) / dVar192, 1.0 <= dVar184)) {
                            dVar184 = 1.0;
                          }
                        }
                        else {
                          dVar184 = (dVar184 - dVar186) / dVar192;
                          if (1.0 <= dVar184) {
                            dVar184 = 1.0;
                          }
                        }
                        if (2.0 <= dVar184) {
                          dVar184 = 2.0;
                        }
                      }
                      lVar102 = -1;
                      cVar119 = '\x05';
                      dVar207 = dVar186;
                      dVar192 = dVar186;
                      do {
                        lVar118 = -1;
                        cVar158 = cVar119;
                        do {
                          lVar126 = 0;
                          do {
                            if (((int)lVar126 != 1 || ((int)lVar118 != 0 || (int)lVar102 != 0)) &&
                               ((1 << (cVar158 + (char)lVar126 & 0x1fU) & uVar31) != 0)) {
                              dVar193 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                          (iVar138 + (int)lVar118) * lVar36 +
                                                          (long)(iVar83 + (int)lVar126)];
                              dVar220 = dVar193;
                              if (dVar193 <= dVar192) {
                                dVar220 = dVar192;
                              }
                              dVar192 = dVar220;
                              if (dVar193 < dVar207) {
                                dVar207 = dVar193;
                              }
                            }
                            lVar126 = lVar126 + 1;
                          } while (lVar126 != 3);
                          cVar158 = cVar158 + '\x03';
                          bVar180 = lVar118 != 0;
                          lVar118 = lVar118 + 1;
                        } while (bVar180);
                        lVar102 = lVar102 + 1;
                        cVar119 = cVar119 + '\t';
                      } while (lVar102 != 2);
                      dVar193 = ((dVar187 - dVar209) * dVar222 +
                                (((dVar185 - dVar216) * dVar194 + dVar186) -
                                (dVar196 + 0.5) * local_aa8)) - dVar186;
                      if (dVar193 <= 1e-13) {
                        dVar192 = 1.0;
                        if ((dVar193 < -1e-13) &&
                           (dVar192 = (dVar207 - dVar186) / dVar193, 1.0 <= dVar192)) {
                          dVar192 = 1.0;
                        }
                      }
                      else {
                        dVar192 = (dVar192 - dVar186) / dVar193;
                        if (1.0 <= dVar192) {
                          dVar192 = 1.0;
                        }
                      }
                      if (dVar184 <= dVar192) {
                        dVar192 = dVar184;
                      }
                      uVar201 = SUB84(dVar186,0);
                      uVar203 = (undefined4)((ulong)dVar186 >> 0x20);
                      dVar184 = dVar192;
                      if ((uVar31 >> 0x13 & 1) != 0) {
                        lVar102 = -1;
                        cVar119 = '\x06';
                        uVar200 = uVar201;
                        uVar202 = uVar203;
                        dVar207 = dVar186;
                        do {
                          lVar118 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar126 = 0;
                            do {
                              if ((((int)lVar118 != 0 || (int)lVar102 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 & 0x1fU) & uVar31) != 0)) {
                                dVar184 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                            (iVar138 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                dVar193 = dVar184;
                                if (dVar184 <= (double)CONCAT44(uVar202,uVar200)) {
                                  dVar193 = (double)CONCAT44(uVar202,uVar200);
                                }
                                if (dVar184 < dVar207) {
                                  dVar207 = dVar184;
                                }
                                uVar200 = SUB84(dVar193,0);
                                uVar202 = (undefined4)((ulong)dVar193 >> 0x20);
                              }
                              lVar126 = lVar126 + 1;
                            } while (lVar126 == 1);
                            lVar118 = lVar118 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar118 != 2);
                          lVar102 = lVar102 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar102 != 2);
                        dVar193 = (((pdVar58 + lVar98 + lVar154 + ((iVar89 - iVar23) + 1))[lVar61] -
                                   dVar209) * dVar222 +
                                  (pdVar58[lVar98 + lVar154 + ((iVar89 - iVar23) + 1)] - dVar196) *
                                  local_aa8 + (0.5 - dVar216) * dVar194 + dVar186) - dVar186;
                        if (dVar193 <= 1e-13) {
                          dVar184 = 1.0;
                          if ((dVar193 < -1e-13) &&
                             (dVar184 = (dVar207 - dVar186) / dVar193, 1.0 <= dVar184)) {
                            dVar184 = 1.0;
                          }
                        }
                        else {
                          dVar184 = ((double)CONCAT44(uVar202,uVar200) - dVar186) / dVar193;
                          if (1.0 <= dVar184) {
                            dVar184 = 1.0;
                          }
                        }
                        if (dVar192 <= dVar184) {
                          dVar184 = dVar192;
                        }
                      }
                      dVar207 = dVar184;
                      if ((uVar31 >> 0x11 & 1) != 0) {
                        lVar102 = -1;
                        cVar119 = '\x05';
                        uVar200 = uVar201;
                        uVar202 = uVar203;
                        dVar192 = dVar186;
                        do {
                          lVar118 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar126 = -1;
                            do {
                              if ((((int)lVar118 != 0 || (int)lVar102 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar207 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                            (iVar138 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                dVar193 = dVar207;
                                if (dVar207 <= (double)CONCAT44(uVar202,uVar200)) {
                                  dVar193 = (double)CONCAT44(uVar202,uVar200);
                                }
                                if (dVar207 < dVar192) {
                                  dVar192 = dVar207;
                                }
                                uVar200 = SUB84(dVar193,0);
                                uVar202 = (undefined4)((ulong)dVar193 >> 0x20);
                              }
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 1);
                            lVar118 = lVar118 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar118 != 2);
                          lVar102 = lVar102 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar102 != 2);
                        dVar193 = (((pdVar58 + lVar98 + lVar154 + (lVar147 - iVar23))[lVar61] -
                                   dVar209) * dVar222 +
                                  (pdVar58[lVar98 + lVar154 + (lVar147 - iVar23)] - dVar196) *
                                  local_aa8 + (dVar186 - (dVar216 + 0.5) * dVar194)) - dVar186;
                        if (dVar193 <= 1e-13) {
                          dVar207 = 1.0;
                          if ((dVar193 < -1e-13) &&
                             (dVar207 = (dVar192 - dVar186) / dVar193, 1.0 <= dVar207)) {
                            dVar207 = 1.0;
                          }
                        }
                        else {
                          dVar207 = ((double)CONCAT44(uVar202,uVar200) - dVar186) / dVar193;
                          if (1.0 <= dVar207) {
                            dVar207 = 1.0;
                          }
                        }
                        if (dVar184 <= dVar207) {
                          dVar207 = dVar184;
                        }
                      }
                      dVar184 = dVar207;
                      if ((uVar31 >> 0x1b & 1) != 0) {
                        cVar119 = '\x0e';
                        lVar102 = 0;
                        dVar192 = dVar186;
                        dVar184 = dVar186;
                        do {
                          lVar118 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar126 = -1;
                            dVar193 = dVar184;
                            do {
                              dVar184 = dVar193;
                              if ((((int)lVar118 != 0 || (int)lVar102 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar220 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                            (iVar138 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                dVar184 = dVar220;
                                if (dVar220 <= dVar193) {
                                  dVar184 = dVar193;
                                }
                                if (dVar220 < dVar192) {
                                  dVar192 = dVar220;
                                }
                              }
                              lVar126 = lVar126 + 1;
                              dVar193 = dVar184;
                            } while (lVar126 != 2);
                            lVar118 = lVar118 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar118 != 2);
                          cVar119 = cVar119 + '\t';
                          bVar180 = lVar102 == 0;
                          lVar102 = lVar102 + 1;
                        } while (bVar180);
                        dVar193 = ((0.5 - dVar209) * dVar222 +
                                  ((pdVar66 + lVar155 + lVar133 + (lVar147 - lVar166))[lVar69] -
                                  dVar196) * local_aa8 +
                                  (pdVar66[lVar155 + lVar133 + (lVar147 - lVar166)] - dVar216) *
                                  dVar194 + dVar186) - dVar186;
                        if (dVar193 <= 1e-13) {
                          dVar184 = 1.0;
                          if ((dVar193 < -1e-13) &&
                             (dVar184 = (dVar192 - dVar186) / dVar193, 1.0 <= dVar184)) {
                            dVar184 = 1.0;
                          }
                        }
                        else {
                          dVar184 = (dVar184 - dVar186) / dVar193;
                          if (1.0 <= dVar184) {
                            dVar184 = 1.0;
                          }
                        }
                        if (dVar207 <= dVar184) {
                          dVar184 = dVar207;
                        }
                      }
                      dVar207 = dVar184;
                      if ((uVar31 >> 9 & 1) != 0) {
                        cVar119 = '\x05';
                        lVar102 = -1;
                        dVar192 = dVar186;
                        do {
                          lVar118 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar126 = -1;
                            do {
                              if ((((int)lVar118 != 0 || (int)lVar102 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar207 = pdVar35[lVar111 + (iVar88 + (int)lVar102) * lVar37 +
                                                            (iVar138 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                dVar193 = dVar207;
                                if (dVar207 <= (double)CONCAT44(uVar203,uVar201)) {
                                  dVar193 = (double)CONCAT44(uVar203,uVar201);
                                }
                                if (dVar207 < dVar192) {
                                  dVar192 = dVar207;
                                }
                                uVar201 = SUB84(dVar193,0);
                                uVar203 = (undefined4)((ulong)dVar193 >> 0x20);
                              }
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 2);
                            lVar118 = lVar118 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar118 != 2);
                          cVar119 = cVar119 + '\t';
                          bVar180 = lVar102 != 0;
                          lVar102 = lVar102 + 1;
                        } while (bVar180);
                        dVar193 = ((((pdVar66 + lVar155 + lVar174 + (lVar147 - lVar166))[lVar69] -
                                    dVar196) * local_aa8 +
                                   (pdVar66[lVar155 + lVar174 + (lVar147 - lVar166)] - dVar216) *
                                   dVar194 + dVar186) - (dVar209 + 0.5) * dVar222) - dVar186;
                        if (dVar193 <= 1e-13) {
                          dVar207 = 1.0;
                          if ((dVar193 < -1e-13) &&
                             (dVar207 = (dVar192 - dVar186) / dVar193, 1.0 <= dVar207)) {
                            dVar207 = 1.0;
                          }
                        }
                        else {
                          dVar207 = ((double)CONCAT44(uVar203,uVar201) - dVar186) / dVar193;
                          if (1.0 <= dVar207) {
                            dVar207 = 1.0;
                          }
                        }
                        if (dVar184 <= dVar207) {
                          dVar207 = dVar184;
                        }
                      }
                      dVar184 = 0.0;
                      if (1 < iVar176) {
                        dVar184 = dVar207;
                      }
                      uVar201 = 0;
                      uVar203 = 0;
                      if (1 < iVar90) {
                        uVar201 = SUB84(dVar207,0);
                        uVar203 = (undefined4)((ulong)dVar207 >> 0x20);
                      }
                      dVar192 = 0.0;
                      if (1 < iVar121) {
                        dVar192 = dVar207;
                      }
                      if (((((dVar208 == 1.0) && (!NAN(dVar208))) &&
                           (pdVar54[lVar100 + lVar179 + (int)(~uVar20 + iVar89)] == 1.0)) &&
                          ((!NAN(pdVar54[lVar100 + lVar179 + (int)(~uVar20 + iVar89)]) &&
                           (pdVar54[lVar100 + lVar179 + (int)((iVar89 - uVar20) + 1)] == 1.0)))) &&
                         (!NAN(pdVar54[lVar100 + lVar179 + (int)((iVar89 - uVar20) + 1)]))) {
                        dVar184 = 1.0;
                      }
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         ((pdVar54[lVar113 + lVar179 + lVar152] == 1.0 &&
                          (((!NAN(pdVar54[lVar113 + lVar179 + lVar152]) &&
                            (pdVar54[lVar179 + ((iVar137 + 1) - iVar21) * lVar55 + lVar152] == 1.0))
                           && (!NAN(pdVar54[lVar179 + ((iVar137 + 1) - iVar21) * lVar55 + lVar152]))
                           ))))) {
                        uVar201 = 0;
                        uVar203 = 0x3ff00000;
                      }
                      if (((dVar208 == 1.0) && (!NAN(dVar208))) &&
                         (((pdVar54[lVar100 + lVar152 + lVar112] == 1.0 &&
                           ((!NAN(pdVar54[lVar100 + lVar152 + lVar112]) &&
                            (pdVar54[lVar100 + lVar152 + lVar99] == 1.0)))) &&
                          (!NAN(pdVar54[lVar100 + lVar152 + lVar99]))))) {
                        dVar192 = 1.0;
                      }
                      local_aa8 = local_aa8 * (double)CONCAT44(uVar203,uVar201);
                      dVar185 = (dVar187 - dVar209) * dVar222 * dVar192 +
                                (dVar185 - dVar216) * dVar194 * dVar184 +
                                (-0.5 - dVar196) * local_aa8 + dVar186;
                      if (dVar185 <= dVar219) {
                        dVar219 = dVar185;
                      }
                      uVar201 = SUB84(dVar183,0);
                      uVar203 = (undefined4)((ulong)dVar183 >> 0x20);
                      if (dVar183 <= dVar219) {
                        uVar201 = SUB84(dVar219,0);
                        uVar203 = (undefined4)((ulong)dVar219 >> 0x20);
                      }
                      local_a28 = pdVar39[lVar141 + lVar171 + lVar42 + (lVar147 - lVar177)] *
                                  dVar182 * -0.5 * local_aa8 + (double)CONCAT44(uVar203,uVar201);
                      auVar190 = _DAT_0077bb30;
                    }
                    else if (((pdVar54[lVar179 + lVar114 + lVar152] != 1.0) ||
                             (NAN(pdVar54[lVar179 + lVar114 + lVar152]))) ||
                            (((pdVar54[lVar179 + lVar122 + lVar152] != 1.0 ||
                              ((NAN(pdVar54[lVar179 + lVar122 + lVar152]) ||
                               (pdVar54[lVar179 + ((local_900 + 2) - lVar163) * lVar55 + lVar152] !=
                                1.0)))) ||
                             (NAN(pdVar54[lVar179 + ((local_900 + 2) - lVar163) * lVar55 + lVar152])
                             )))) {
                      if ((pdVar54[lVar179 + lVar122 + lVar152] != 1.0) ||
                         (NAN(pdVar54[lVar179 + lVar122 + lVar152]))) goto LAB_004115ec;
                      lVar102 = lVar147 - lVar148;
                      local_a28 = pdVar35[lVar123 + lVar168 + lVar111 + lVar102];
                      dVar216 = local_a28 - pdVar35[lVar142 + lVar168 + lVar111 + lVar102];
                      dVar209 = pdVar35[lVar143 + lVar168 + lVar111 + lVar102] - local_a28;
                      dVar216 = dVar216 + dVar216;
                      dVar209 = dVar209 + dVar209;
                      dVar185 = (pdVar35[lVar143 + lVar168 + lVar111 + lVar102] -
                                pdVar35[lVar142 + lVar168 + lVar111 + lVar102]) * 0.5;
                      dVar196 = ABS(dVar216);
                      uVar181 = -(ulong)(0.0 < dVar185);
                      dVar185 = ABS(dVar185);
                      dVar187 = ABS(dVar209);
                      if (dVar196 <= dVar185) {
                        dVar185 = dVar196;
                      }
                      if (dVar185 <= dVar187) {
                        dVar187 = dVar185;
                      }
                      uVar204 = -(ulong)(0.0 < dVar216 * dVar209) & (ulong)dVar187;
                      local_a28 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                          uVar181 & uVar204) *
                                  (-1.0 - pdVar39[lVar141 + lVar171 + lVar42 + (lVar147 - lVar177)]
                                          * dVar182) * 0.5 + local_a28;
                    }
                    else {
                      lVar102 = lVar147 - lVar148;
                      local_a28 = pdVar35[lVar123 + lVar168 + lVar111 + lVar102];
                      dVar196 = local_a28 - pdVar35[lVar142 + lVar168 + lVar111 + lVar102];
                      dVar216 = pdVar35[lVar142 + lVar168 + lVar111 + lVar102] -
                                pdVar35[lVar144 + lVar168 + lVar111 + lVar102];
                      dVar185 = 0.0;
                      dVar187 = 0.0;
                      if (0.0 <= dVar196 * dVar216) {
                        dVar187 = ABS(dVar196);
                        if (ABS(dVar216) <= ABS(dVar196)) {
                          dVar187 = ABS(dVar216);
                        }
                        dVar187 = dVar187 + dVar187;
                      }
                      dVar186 = pdVar35[lVar111 + lVar168 + ((local_900 + 2) - lVar130) * lVar36 +
                                                            lVar102] -
                                pdVar35[lVar143 + lVar168 + lVar111 + lVar102];
                      dVar219 = pdVar35[lVar143 + lVar168 + lVar111 + lVar102] - local_a28;
                      dVar209 = (dVar219 + dVar186) * 0.5;
                      if (0.0 <= dVar219 * dVar186) {
                        dVar185 = ABS(dVar186);
                        if (ABS(dVar219) <= ABS(dVar186)) {
                          dVar185 = ABS(dVar219);
                        }
                        dVar185 = dVar185 + dVar185;
                      }
                      dVar183 = (dVar196 + dVar219) * 0.5;
                      dVar186 = 0.0;
                      if (0.0 <= dVar196 * dVar219) {
                        dVar186 = ABS(dVar219);
                        if (ABS(dVar196) <= ABS(dVar219)) {
                          dVar186 = ABS(dVar196);
                        }
                        dVar186 = dVar186 + dVar186;
                      }
                      dVar216 = (dVar196 + dVar216) * 0.5;
                      dVar196 = ABS(dVar216);
                      if (dVar187 <= dVar196) {
                        dVar196 = dVar187;
                      }
                      dVar187 = ABS(dVar209);
                      if (dVar185 <= dVar187) {
                        dVar187 = dVar185;
                      }
                      dVar185 = ABS(dVar183 * 1.3333333333333333 +
                                    (dVar187 * (double)((ulong)dVar209 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar196 * (double)((ulong)dVar216 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar186 <= dVar185) {
                        dVar185 = dVar186;
                      }
                      local_a28 = dVar185 * (double)((ulong)dVar183 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (-1.0 - pdVar39[lVar141 + lVar171 + lVar42 + (lVar147 - lVar177)]
                                          * dVar182) * 0.5 + local_a28;
                    }
                    dVar187 = pdVar54[lVar113 + lVar152 + lVar179];
                    auVar213 = _DAT_0077bb40;
                    if ((dVar187 != 1.0) || (NAN(dVar187))) {
LAB_0041334f:
                      lVar102 = lVar147 - lVar165;
                      dVar196 = pdVar62[lVar149 + lVar135 + lVar102];
                      dVar216 = (pdVar62 + lVar149 + lVar135 + lVar102)[lVar65];
                      pdVar104 = pdVar57 + (iVar160 - iVar161) * lVar33 +
                                           iVar106 * lVar32 + (long)(iVar89 - iVar8);
                      dVar209 = pdVar104[lVar34];
                      dVar186 = *pdVar104;
                      dVar219 = pdVar104[lVar34 * 2];
                      lVar118 = (long)(iVar89 - iVar9);
                      dVar183 = pdVar35[lVar123 + lVar95 + lVar111 + lVar118];
                      dVar184 = pdVar35[lVar115 + lVar118 + lVar95 + lVar111];
                      uVar31 = pEVar51[lVar93 + (lVar2 - lVar162) * lVar52 + lVar117].flag;
                      lVar117 = -1;
                      cVar119 = '\x05';
                      lVar126 = 0;
                      do {
                        iVar121 = (int)lVar117;
                        lVar127 = -1;
                        cVar158 = cVar119;
                        do {
                          iVar90 = (int)lVar127;
                          iVar109 = (int)lVar126;
                          ppdVar103 = &local_2d8.q.p + (long)iVar109 * 3;
                          lVar126 = 0;
                          do {
                            iVar176 = (int)lVar126;
                            if ((iVar176 == 1 && (iVar90 == 0 && iVar121 == 0)) ||
                               ((1 << (cVar158 + (char)lVar126 & 0x1fU) & uVar31) == 0)) {
                              *ppdVar103 = (double *)0x0;
                              ppdVar103[1] = (double *)0x0;
                              ppdVar103[2] = (double *)0x0;
                            }
                            else {
                              pdVar104 = pdVar57 + ((iVar160 - iVar161) + iVar121) * lVar33 +
                                                   (iVar106 + iVar90) * lVar32 +
                                                   (long)(iVar84 + iVar176);
                              dVar185 = pdVar104[lVar34];
                              *ppdVar103 = (double *)
                                           ((*pdVar104 + (double)(iVar176 + -1)) - dVar186);
                              ppdVar103[1] = (double *)((dVar185 + (double)iVar90) - dVar209);
                              ppdVar103[2] = (double *)
                                             ((pdVar104[lVar34 * 2] + (double)iVar121) - dVar219);
                            }
                            lVar126 = lVar126 + 1;
                            ppdVar103 = ppdVar103 + 3;
                          } while (lVar126 != 3);
                          lVar127 = lVar127 + 1;
                          cVar158 = cVar158 + '\x03';
                          lVar126 = (long)iVar109 + 3;
                        } while (lVar127 != 2);
                        lVar117 = lVar117 + 1;
                        cVar119 = cVar119 + '\t';
                        lVar126 = (long)iVar109 + 3;
                      } while (lVar117 != 2);
                      lVar126 = -1;
                      cVar119 = '\x05';
                      lVar117 = 0;
                      do {
                        lVar127 = -1;
                        cVar158 = cVar119;
                        do {
                          iVar121 = (int)lVar117;
                          lVar117 = 0;
                          do {
                            dVar185 = 0.0;
                            if (((int)lVar117 != 1 || ((int)lVar127 != 0 || (int)lVar126 != 0)) &&
                               ((1 << (cVar158 + (char)lVar117 & 0x1fU) & uVar31) != 0)) {
                              dVar185 = pdVar35[lVar111 + (iVar88 + (int)lVar126) * lVar37 +
                                                          (iVar107 + (int)lVar127) * lVar36 +
                                                          (long)(iVar83 + (int)lVar117)] - dVar184;
                            }
                            adStack_3b8[iVar121 + lVar117] = dVar185;
                            lVar117 = lVar117 + 1;
                          } while (lVar117 != 3);
                          lVar127 = lVar127 + 1;
                          cVar158 = cVar158 + '\x03';
                          lVar117 = (long)iVar121 + 3;
                        } while (lVar127 != 2);
                        lVar126 = lVar126 + 1;
                        cVar119 = cVar119 + '\t';
                        lVar117 = (long)iVar121 + 3;
                      } while (lVar126 != 2);
                      pdVar104 = &local_408;
                      lVar117 = 0;
                      do {
                        lVar126 = 0;
                        auVar189 = auVar190;
                        do {
                          if (SUB164(auVar189 ^ _DAT_0077bb40,4) == -0x80000000 &&
                              SUB164(auVar189 ^ _DAT_0077bb40,0) < -0x7ffffffd) {
                            *(undefined8 *)((long)pdVar104 + lVar126) = 0;
                            *(undefined8 *)((long)pdVar104 + lVar126 + 0x18) = 0;
                          }
                          lVar127 = auVar189._8_8_;
                          auVar189._0_8_ = auVar189._0_8_ + 2;
                          auVar189._8_8_ = lVar127 + 2;
                          lVar126 = lVar126 + 0x30;
                        } while (lVar126 != 0x60);
                        lVar117 = lVar117 + 1;
                        pdVar104 = pdVar104 + 1;
                      } while (lVar117 != 3);
                      dVar221 = 0.0;
                      dVar205 = 0.0;
                      dVar207 = 0.0;
                      pLVar105 = &local_2d8.q.kstride;
                      lVar117 = 0;
                      dVar192 = local_3c8;
                      dVar193 = local_408;
                      dVar220 = local_400;
                      dVar185 = local_3f8;
                      dVar191 = local_3e8;
                      dVar214 = dStack_3e0;
                      do {
                        dVar194 = (double)*pLVar105;
                        pdVar104 = ((Array4<const_double> *)(pLVar105 + -2))->p;
                        dVar218 = (double)pLVar105[-1];
                        dVar191 = dVar191 + dVar218 * (double)pLVar105[-1];
                        dVar214 = dVar214 + dVar218 * (double)*pLVar105;
                        dVar192 = dVar192 + dVar194 * dVar194;
                        dVar222 = adStack_3b8[lVar117];
                        dVar193 = dVar193 + (double)pdVar104 * (double)pdVar104;
                        dVar221 = dVar221 + dVar222 * (double)pdVar104;
                        dVar220 = dVar220 + dVar218 * (double)pdVar104;
                        dVar205 = dVar205 + dVar222 * dVar218;
                        dVar185 = dVar185 + dVar194 * (double)pdVar104;
                        dVar207 = dVar207 + dVar222 * dVar194;
                        lVar117 = lVar117 + 1;
                        pLVar105 = pLVar105 + 3;
                      } while (lVar117 != 0x1b);
                      dVar222 = dVar191 * dVar192 - dVar214 * dVar214;
                      dVar194 = dVar192 * dVar220 - dVar185 * dVar214;
                      dVar192 = dVar192 * dVar205 - dVar207 * dVar214;
                      dVar215 = dVar220 * dVar214 - dVar191 * dVar185;
                      dVar218 = dVar185 * dVar215 + (dVar222 * dVar193 - dVar220 * dVar194);
                      local_a38 = (dVar185 * (dVar205 * dVar214 - dVar191 * dVar207) +
                                  (dVar222 * dVar221 - dVar220 * dVar192)) / dVar218;
                      if ((dVar187 == 1.0) && (!NAN(dVar187))) {
                        if ((pdVar54[lVar113 + lVar179 + ((lVar147 + -1) - lVar170)] == 1.0) &&
                           (!NAN(pdVar54[lVar113 + lVar179 + ((lVar147 + -1) - lVar170)]))) {
                          if ((pdVar54[lVar113 + lVar179 + ((lVar147 + 1) - lVar170)] == 1.0) &&
                             (!NAN(pdVar54[lVar113 + lVar179 + ((lVar147 + 1) - lVar170)]))) {
                            dVar198 = dVar184 - pdVar35[lVar115 + lVar95 + lVar111 + ((lVar147 + -1)
                                                                                     - lVar148)];
                            dVar199 = pdVar35[lVar115 + lVar95 + lVar111 + ((lVar147 + 1) - lVar148)
                                             ] - dVar184;
                            dVar198 = dVar198 + dVar198;
                            dVar199 = dVar199 + dVar199;
                            dVar222 = (pdVar35[lVar115 + lVar95 + lVar111 + ((lVar147 + 1) - lVar148
                                                                            )] -
                                      pdVar35[lVar115 + lVar95 + lVar111 + ((lVar147 + -1) - lVar148
                                                                           )]) * 0.5;
                            dVar217 = ABS(dVar198);
                            uVar181 = -(ulong)(0.0 < dVar222);
                            dVar222 = ABS(dVar222);
                            dVar195 = ABS(dVar199);
                            if (dVar217 <= dVar222) {
                              dVar222 = dVar217;
                            }
                            if (dVar222 <= dVar195) {
                              dVar195 = dVar222;
                            }
                            uVar204 = -(ulong)(0.0 < dVar198 * dVar199) & (ulong)dVar195;
                            local_a38 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                                uVar181 & uVar204);
                          }
                        }
                      }
                      dVar222 = dVar220 * dVar207 - dVar185 * dVar205;
                      local_aa8 = (dVar185 * dVar222 + (dVar192 * dVar193 - dVar194 * dVar221)) /
                                  dVar218;
                      if (((((dVar187 == 1.0) && (!NAN(dVar187))) && (dVar208 == 1.0)) &&
                          ((!NAN(dVar208) && (pdVar54[lVar179 + lVar114 + lVar152] == 1.0)))) &&
                         (!NAN(pdVar54[lVar179 + lVar114 + lVar152]))) {
                        dVar194 = dVar184 - pdVar35[lVar144 + lVar95 + lVar111 + lVar118];
                        dVar185 = (dVar183 - dVar184) + (dVar183 - dVar184);
                        dVar194 = dVar194 + dVar194;
                        dVar195 = (dVar183 - pdVar35[lVar144 + lVar95 + lVar111 + lVar118]) * 0.5;
                        dVar198 = ABS(dVar194);
                        uVar181 = -(ulong)(0.0 < dVar195);
                        dVar195 = ABS(dVar195);
                        dVar192 = ABS(dVar185);
                        if (dVar198 <= dVar195) {
                          dVar195 = dVar198;
                        }
                        if (dVar195 <= dVar192) {
                          dVar192 = dVar195;
                        }
                        uVar204 = -(ulong)(0.0 < dVar194 * dVar185) & (ulong)dVar192;
                        local_aa8 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                            uVar181 & uVar204);
                      }
                      dVar218 = (dVar221 * dVar215 +
                                (dVar193 * (dVar191 * dVar207 - dVar214 * dVar205) -
                                dVar222 * dVar220)) / dVar218;
                      if (((dVar187 == 1.0) && (!NAN(dVar187))) &&
                         ((pdVar54[lVar113 + lVar152 + lVar96] == 1.0 &&
                          (((!NAN(pdVar54[lVar113 + lVar152 + lVar96]) &&
                            (pdVar54[lVar113 + lVar152 + lVar97] == 1.0)) &&
                           (!NAN(pdVar54[lVar113 + lVar152 + lVar97]))))))) {
                        dVar193 = dVar184 - pdVar35[lVar115 + lVar118 + lVar132 + lVar111];
                        dVar220 = pdVar35[lVar115 + lVar118 + lVar173 + lVar111] - dVar184;
                        dVar193 = dVar193 + dVar193;
                        dVar220 = dVar220 + dVar220;
                        dVar207 = (pdVar35[lVar115 + lVar118 + lVar173 + lVar111] -
                                  pdVar35[lVar115 + lVar118 + lVar132 + lVar111]) * 0.5;
                        dVar192 = ABS(dVar193);
                        uVar181 = -(ulong)(0.0 < dVar207);
                        dVar207 = ABS(dVar207);
                        dVar185 = ABS(dVar220);
                        if (dVar192 <= dVar207) {
                          dVar207 = dVar192;
                        }
                        if (dVar207 <= dVar185) {
                          dVar185 = dVar207;
                        }
                        uVar204 = -(ulong)(0.0 < dVar193 * dVar220) & (ulong)dVar185;
                        dVar218 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                          uVar181 & uVar204);
                      }
                      dVar185 = dVar184;
                      if (dVar183 <= dVar184) {
                        dVar185 = dVar183;
                      }
                      dVar216 = dVar216 - dVar219;
                      dVar207 = dVar184;
                      if (dVar184 <= dVar183) {
                        dVar207 = dVar183;
                      }
                      dVar196 = dVar196 - dVar186;
                      iVar90 = 0;
                      iVar121 = 0;
                      iVar109 = 0;
                      iVar176 = 0;
                      uVar120 = 0xffffffff;
                      do {
                        uVar139 = uVar120 + 1;
                        uVar140 = 0xffffffff;
                        iVar169 = iVar90;
                        do {
                          uVar1 = uVar140 + 1;
                          iVar108 = 5;
                          do {
                            if (((uVar31 >> (iVar108 + iVar169 & 0x1fU) & 1) != 0) &&
                               ((iVar108 != 6 || uVar140 != 0) || uVar120 != 0)) {
                              iVar121 = iVar121 + (uint)((iVar108 - 5U & 0xfffffffd) == 0 &&
                                                        (uVar140 == 0 && uVar120 == 0));
                              iVar109 = iVar109 + (uint)((iVar108 == 6 && uVar120 == 0) &&
                                                        (uVar1 & 0xfffffffd) == 0);
                              iVar176 = iVar176 + (uint)((iVar108 == 6 && uVar140 == 0) &&
                                                        (uVar139 & 0xfffffffd) == 0);
                            }
                            iVar108 = iVar108 + 1;
                          } while (iVar108 != 8);
                          iVar169 = iVar169 + 3;
                          uVar140 = uVar1;
                        } while (uVar1 != 2);
                        iVar90 = iVar90 + 9;
                        uVar120 = uVar139;
                      } while (uVar139 != 2);
                      dVar183 = 2.0;
                      if ((uVar31 >> 0x15 & 1) != 0) {
                        lVar117 = -1;
                        cVar119 = '\b';
                        auVar190._8_8_ = 0;
                        auVar190._0_8_ = (ulong)dVar184;
                        dVar192 = dVar184;
                        do {
                          lVar118 = 0;
                          cVar158 = cVar119;
                          do {
                            lVar126 = -1;
                            do {
                              if ((((int)lVar118 != 0 || (int)lVar117 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar183 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                uVar201 = SUB84(dVar183,0);
                                uVar203 = (undefined4)((ulong)dVar183 >> 0x20);
                                if (dVar183 <= auVar190._0_8_) {
                                  uVar201 = auVar190._0_4_;
                                  uVar203 = auVar190._4_4_;
                                }
                                auVar190._4_4_ = uVar203;
                                auVar190._0_4_ = uVar201;
                                auVar190._8_8_ = 0;
                                if (dVar183 < dVar192) {
                                  dVar192 = dVar183;
                                }
                              }
                              lVar126 = lVar126 + 1;
                            } while (lVar126 != 2);
                            cVar158 = cVar158 + '\x03';
                            bVar180 = lVar118 == 0;
                            lVar118 = lVar118 + 1;
                          } while (bVar180);
                          lVar117 = lVar117 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar117 != 2);
                        dVar193 = (dVar216 * dVar218 +
                                  (0.5 - dVar209) * local_aa8 + dVar196 * local_a38 + dVar184) -
                                  dVar184;
                        if (dVar193 <= 1e-13) {
                          dVar183 = 1.0;
                          if ((dVar193 < -1e-13) &&
                             (dVar183 = (dVar192 - dVar184) / dVar193, 1.0 <= dVar183)) {
                            dVar183 = 1.0;
                          }
                        }
                        else {
                          dVar183 = (auVar190._0_8_ - dVar184) / dVar193;
                          if (1.0 <= dVar183) {
                            dVar183 = 1.0;
                          }
                        }
                        if (2.0 <= dVar183) {
                          dVar183 = 2.0;
                        }
                      }
                      dVar192 = dVar183;
                      if ((short)uVar31 < 0) {
                        lVar117 = -1;
                        cVar119 = '\x05';
                        dVar193 = dVar184;
                        dVar192 = dVar184;
                        do {
                          lVar118 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar126 = -1;
                            dVar220 = dVar192;
                            do {
                              dVar192 = dVar220;
                              if ((((int)lVar118 != 0 || (int)lVar117 != 0) || (int)lVar126 != 0) &&
                                 ((1 << (cVar158 + (char)lVar126 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar191 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar118) * lVar36 +
                                                            (long)(iVar5 + (int)lVar126)];
                                dVar192 = dVar191;
                                if (dVar191 <= dVar220) {
                                  dVar192 = dVar220;
                                }
                                if (dVar191 < dVar193) {
                                  dVar193 = dVar191;
                                }
                              }
                              lVar126 = lVar126 + 1;
                              dVar220 = dVar192;
                            } while (lVar126 != 2);
                            cVar158 = cVar158 + '\x03';
                            bVar180 = lVar118 != 0;
                            lVar118 = lVar118 + 1;
                          } while (bVar180);
                          lVar117 = lVar117 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar117 != 2);
                        dVar220 = (((pdVar62 + lVar135 + (lVar2 - iVar25) * lVar63 + lVar102)
                                    [lVar65] - dVar219) * dVar218 +
                                  (((pdVar62[lVar135 + (lVar2 - iVar25) * lVar63 + lVar102] -
                                    dVar186) * local_a38 + dVar184) - (dVar209 + 0.5) * local_aa8))
                                  - dVar184;
                        if (dVar220 <= 1e-13) {
                          dVar192 = 1.0;
                          if ((dVar220 < -1e-13) &&
                             (dVar192 = (dVar193 - dVar184) / dVar220, 1.0 <= dVar192)) {
                            dVar192 = 1.0;
                          }
                        }
                        else {
                          dVar192 = (dVar192 - dVar184) / dVar220;
                          if (1.0 <= dVar192) {
                            dVar192 = 1.0;
                          }
                        }
                        if (dVar183 <= dVar192) {
                          dVar192 = dVar183;
                        }
                      }
                      dVar183 = dVar192;
                      if ((uVar31 >> 0x13 & 1) != 0) {
                        lVar117 = -1;
                        cVar119 = '\x06';
                        auVar210._8_8_ = 0;
                        auVar210._0_8_ = (ulong)dVar184;
                        dVar193 = dVar184;
                        do {
                          lVar102 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar118 = 0;
                            do {
                              if ((((int)lVar102 != 0 || (int)lVar117 != 0) || (int)lVar118 != 0) &&
                                 ((1 << (cVar158 + (char)lVar118 & 0x1fU) & uVar31) != 0)) {
                                dVar183 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar102) * lVar36 +
                                                            (long)(iVar5 + (int)lVar118)];
                                uVar201 = SUB84(dVar183,0);
                                uVar203 = (undefined4)((ulong)dVar183 >> 0x20);
                                if (dVar183 <= auVar210._0_8_) {
                                  uVar201 = auVar210._0_4_;
                                  uVar203 = auVar210._4_4_;
                                }
                                if (dVar183 < dVar193) {
                                  dVar193 = dVar183;
                                }
                                auVar210._4_4_ = uVar203;
                                auVar210._0_4_ = uVar201;
                                auVar210._8_8_ = 0;
                              }
                              lVar118 = lVar118 + 1;
                            } while (lVar118 == 1);
                            lVar102 = lVar102 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar102 != 2);
                          lVar117 = lVar117 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar117 != 2);
                        dVar220 = (((pdVar58 + lVar98 + lVar116 + ((iVar89 - iVar23) + 1))[lVar61] -
                                   dVar219) * dVar218 +
                                  (pdVar58[lVar98 + lVar116 + ((iVar89 - iVar23) + 1)] - dVar209) *
                                  local_aa8 + (0.5 - dVar186) * local_a38 + dVar184) - dVar184;
                        if (dVar220 <= 1e-13) {
                          dVar183 = 1.0;
                          if ((dVar220 < -1e-13) &&
                             (dVar183 = (dVar193 - dVar184) / dVar220, 1.0 <= dVar183)) {
                            dVar183 = 1.0;
                          }
                        }
                        else {
                          dVar183 = (auVar210._0_8_ - dVar184) / dVar220;
                          if (1.0 <= dVar183) {
                            dVar183 = 1.0;
                          }
                        }
                        if (dVar192 <= dVar183) {
                          dVar183 = dVar192;
                        }
                      }
                      dVar192 = dVar183;
                      if ((uVar31 >> 0x11 & 1) != 0) {
                        lVar117 = -1;
                        cVar119 = '\x05';
                        auVar211._8_8_ = 0;
                        auVar211._0_8_ = (ulong)dVar184;
                        dVar193 = dVar184;
                        do {
                          lVar102 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar118 = -1;
                            do {
                              if ((((int)lVar102 != 0 || (int)lVar117 != 0) || (int)lVar118 != 0) &&
                                 ((1 << (cVar158 + (char)lVar118 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar192 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar102) * lVar36 +
                                                            (long)(iVar5 + (int)lVar118)];
                                uVar201 = SUB84(dVar192,0);
                                uVar203 = (undefined4)((ulong)dVar192 >> 0x20);
                                if (dVar192 <= auVar211._0_8_) {
                                  uVar201 = auVar211._0_4_;
                                  uVar203 = auVar211._4_4_;
                                }
                                if (dVar192 < dVar193) {
                                  dVar193 = dVar192;
                                }
                                auVar211._4_4_ = uVar203;
                                auVar211._0_4_ = uVar201;
                                auVar211._8_8_ = 0;
                              }
                              lVar118 = lVar118 + 1;
                            } while (lVar118 != 1);
                            lVar102 = lVar102 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar102 != 2);
                          lVar117 = lVar117 + 1;
                          cVar119 = cVar119 + '\t';
                        } while (lVar117 != 2);
                        dVar220 = (((pdVar58 + lVar98 + lVar116 + (lVar147 - iVar23))[lVar61] -
                                   dVar219) * dVar218 +
                                  (pdVar58[lVar98 + lVar116 + (lVar147 - iVar23)] - dVar209) *
                                  local_aa8 + (dVar184 - (dVar186 + 0.5) * local_a38)) - dVar184;
                        if (dVar220 <= 1e-13) {
                          dVar192 = 1.0;
                          if ((dVar220 < -1e-13) &&
                             (dVar192 = (dVar193 - dVar184) / dVar220, 1.0 <= dVar192)) {
                            dVar192 = 1.0;
                          }
                        }
                        else {
                          dVar192 = (auVar211._0_8_ - dVar184) / dVar220;
                          if (1.0 <= dVar192) {
                            dVar192 = 1.0;
                          }
                        }
                        if (dVar183 <= dVar192) {
                          dVar192 = dVar183;
                        }
                      }
                      dVar183 = dVar192;
                      if ((uVar31 >> 0x1b & 1) != 0) {
                        cVar119 = '\x0e';
                        auVar197._8_8_ = 0;
                        auVar197._0_8_ = (ulong)dVar184;
                        lVar117 = 0;
                        dVar193 = dVar184;
                        do {
                          lVar102 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar118 = -1;
                            do {
                              if ((((int)lVar102 != 0 || (int)lVar117 != 0) || (int)lVar118 != 0) &&
                                 ((1 << (cVar158 + (char)lVar118 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar183 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar102) * lVar36 +
                                                            (long)(iVar5 + (int)lVar118)];
                                uVar201 = SUB84(dVar183,0);
                                uVar203 = (undefined4)((ulong)dVar183 >> 0x20);
                                if (dVar183 <= auVar197._0_8_) {
                                  uVar201 = auVar197._0_4_;
                                  uVar203 = auVar197._4_4_;
                                }
                                if (dVar183 < dVar193) {
                                  dVar193 = dVar183;
                                }
                                auVar197._4_4_ = uVar203;
                                auVar197._0_4_ = uVar201;
                                auVar197._8_8_ = 0;
                              }
                              lVar118 = lVar118 + 1;
                            } while (lVar118 != 2);
                            lVar102 = lVar102 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar102 != 2);
                          cVar119 = cVar119 + '\t';
                          bVar180 = lVar117 == 0;
                          lVar117 = lVar117 + 1;
                        } while (bVar180);
                        dVar220 = ((0.5 - dVar219) * dVar218 +
                                  ((pdVar66 + lVar133 + lVar101 + (lVar147 - lVar166))[lVar69] -
                                  dVar209) * local_aa8 +
                                  (pdVar66[lVar133 + lVar101 + (lVar147 - lVar166)] - dVar186) *
                                  local_a38 + dVar184) - dVar184;
                        if (dVar220 <= 1e-13) {
                          dVar183 = 1.0;
                          if ((dVar220 < -1e-13) &&
                             (dVar183 = (dVar193 - dVar184) / dVar220, 1.0 <= dVar183)) {
                            dVar183 = 1.0;
                          }
                        }
                        else {
                          dVar183 = (auVar197._0_8_ - dVar184) / dVar220;
                          if (1.0 <= dVar183) {
                            dVar183 = 1.0;
                          }
                        }
                        if (dVar192 <= dVar183) {
                          dVar183 = dVar192;
                        }
                      }
                      dVar192 = dVar183;
                      if ((uVar31 >> 9 & 1) != 0) {
                        cVar119 = '\x05';
                        auVar212._8_8_ = 0;
                        auVar212._0_8_ = (ulong)dVar184;
                        lVar117 = -1;
                        dVar193 = dVar184;
                        do {
                          lVar102 = -1;
                          cVar158 = cVar119;
                          do {
                            lVar118 = -1;
                            do {
                              if ((((int)lVar102 != 0 || (int)lVar117 != 0) || (int)lVar118 != 0) &&
                                 ((1 << (cVar158 + (char)lVar118 + 1U & 0x1f) & uVar31) != 0)) {
                                dVar192 = pdVar35[lVar111 + (iVar88 + (int)lVar117) * lVar37 +
                                                            (iVar107 + (int)lVar102) * lVar36 +
                                                            (long)(iVar5 + (int)lVar118)];
                                uVar201 = SUB84(dVar192,0);
                                uVar203 = (undefined4)((ulong)dVar192 >> 0x20);
                                if (dVar192 <= auVar212._0_8_) {
                                  uVar201 = auVar212._0_4_;
                                  uVar203 = auVar212._4_4_;
                                }
                                if (dVar192 < dVar193) {
                                  dVar193 = dVar192;
                                }
                                auVar212._4_4_ = uVar203;
                                auVar212._0_4_ = uVar201;
                                auVar212._8_8_ = 0;
                              }
                              lVar118 = lVar118 + 1;
                            } while (lVar118 != 2);
                            lVar102 = lVar102 + 1;
                            cVar158 = cVar158 + '\x03';
                          } while (lVar102 != 2);
                          cVar119 = cVar119 + '\t';
                          bVar180 = lVar117 != 0;
                          lVar117 = lVar117 + 1;
                        } while (bVar180);
                        dVar186 = ((((pdVar66 + lVar174 + lVar101 + (lVar147 - lVar166))[lVar69] -
                                    dVar209) * local_aa8 +
                                   (pdVar66[lVar174 + lVar101 + (lVar147 - lVar166)] - dVar186) *
                                   local_a38 + dVar184) - (dVar219 + 0.5) * dVar218) - dVar184;
                        if (dVar186 <= 1e-13) {
                          dVar192 = 1.0;
                          if ((dVar186 < -1e-13) &&
                             (dVar192 = (dVar193 - dVar184) / dVar186, 1.0 <= dVar192)) {
                            dVar192 = 1.0;
                          }
                        }
                        else {
                          dVar192 = (auVar212._0_8_ - dVar184) / dVar186;
                          if (1.0 <= dVar192) {
                            dVar192 = 1.0;
                          }
                        }
                        if (dVar183 <= dVar192) {
                          dVar192 = dVar183;
                        }
                      }
                      dVar186 = 0.0;
                      if (1 < iVar121) {
                        dVar186 = dVar192;
                      }
                      dVar219 = 0.0;
                      if (1 < iVar109) {
                        dVar219 = dVar192;
                      }
                      dVar183 = 0.0;
                      if (1 < iVar176) {
                        dVar183 = dVar192;
                      }
                      if ((((dVar187 == 1.0) && (!NAN(dVar187))) &&
                          (pdVar54[lVar113 + lVar179 + (int)(~uVar20 + iVar89)] == 1.0)) &&
                         (((!NAN(pdVar54[lVar113 + lVar179 + (int)(~uVar20 + iVar89)]) &&
                           (pdVar54[lVar113 + lVar179 + (int)((iVar89 - uVar20) + 1)] == 1.0)) &&
                          (!NAN(pdVar54[lVar113 + lVar179 + (int)((iVar89 - uVar20) + 1)]))))) {
                        dVar186 = 1.0;
                      }
                      if (((dVar187 == 1.0) && (!NAN(dVar187))) &&
                         ((dVar208 == 1.0 &&
                          (((!NAN(dVar208) &&
                            (pdVar54[lVar179 + ((iVar137 - iVar21) + -2) * lVar55 + lVar152] == 1.0)
                            ) && (!NAN(pdVar54[lVar179 + ((iVar137 - iVar21) + -2) * lVar55 +
                                                         lVar152]))))))) {
                        dVar219 = 1.0;
                      }
                      if (((dVar187 == 1.0) && (!NAN(dVar187))) &&
                         (((pdVar54[lVar113 + lVar152 + lVar112] == 1.0 &&
                           ((!NAN(pdVar54[lVar113 + lVar152 + lVar112]) &&
                            (pdVar54[lVar113 + lVar152 + lVar99] == 1.0)))) &&
                          (!NAN(pdVar54[lVar113 + lVar152 + lVar99]))))) {
                        dVar183 = 1.0;
                      }
                      dVar208 = dVar216 * dVar218 * dVar183 +
                                (0.5 - dVar209) * local_aa8 * dVar219 +
                                dVar196 * local_a38 * dVar186 + dVar184;
                      if (dVar208 <= dVar207) {
                        dVar207 = dVar208;
                      }
                      if (dVar185 <= dVar207) {
                        dVar185 = dVar207;
                      }
                      dVar185 = pdVar39[lVar42 + lVar171 + lVar124 + (lVar147 - lVar177)] *
                                dVar182 * -0.5 * local_aa8 * dVar219 + dVar185;
                      auVar190 = _DAT_0077bb30;
                    }
                    else {
                      dVar185 = pdVar54[lVar179 + ((int)lVar3 - iVar21) * lVar55 + lVar152];
                      if (((dVar185 != 1.0) ||
                          (((NAN(dVar185) || (dVar208 != 1.0)) || (NAN(dVar208))))) ||
                         ((((pdVar54[lVar179 + ((iVar137 + -3) - iVar21) * lVar55 + lVar152] != 1.0
                            || (NAN(pdVar54[lVar179 + ((iVar137 + -3) - iVar21) * lVar55 + lVar152])
                               )) || (pdVar54[lVar179 + ((int)lVar4 - iVar21) * lVar55 + lVar152] !=
                                      1.0)) ||
                          (NAN(pdVar54[lVar179 + ((int)lVar4 - iVar21) * lVar55 + lVar152]))))) {
                        if (((dVar208 != 1.0) || (NAN(dVar208))) ||
                           ((dVar185 != 1.0 || (NAN(dVar185))))) goto LAB_0041334f;
                        lVar117 = lVar147 - lVar148;
                        dVar185 = pdVar35[lVar142 + lVar168 + lVar111 + lVar117];
                        dVar196 = dVar185 - pdVar35[lVar111 + lVar168 + lVar125 + lVar117];
                        dVar216 = pdVar35[lVar123 + lVar168 + lVar111 + lVar117] - dVar185;
                        dVar196 = dVar196 + dVar196;
                        dVar216 = dVar216 + dVar216;
                        dVar208 = (pdVar35[lVar123 + lVar168 + lVar111 + lVar117] -
                                  pdVar35[lVar111 + lVar168 + lVar125 + lVar117]) * 0.5;
                        dVar209 = ABS(dVar196);
                        uVar181 = -(ulong)(0.0 < dVar208);
                        dVar208 = ABS(dVar208);
                        dVar187 = ABS(dVar216);
                        if (dVar209 <= dVar208) {
                          dVar208 = dVar209;
                        }
                        if (dVar208 <= dVar187) {
                          dVar187 = dVar208;
                        }
                        uVar204 = -(ulong)(0.0 < dVar196 * dVar216) & (ulong)dVar187;
                        dVar185 = (double)(~uVar181 & (uVar204 ^ 0x8000000000000000) |
                                          uVar181 & uVar204) *
                                  (1.0 - pdVar39[lVar42 + lVar171 + lVar124 + (lVar147 - lVar177)] *
                                         dVar182) * 0.5 + dVar185;
                      }
                      else {
                        lVar117 = lVar147 - lVar148;
                        dVar185 = pdVar35[lVar142 + lVar168 + lVar111 + lVar117];
                        dVar196 = dVar185 - pdVar35[lVar111 + lVar168 + lVar125 + lVar117];
                        dVar216 = pdVar35[lVar111 + lVar168 + lVar125 + lVar117] -
                                  pdVar35[lVar111 + lVar168 + ((iVar137 + -3) - iVar10) * lVar36 +
                                                              lVar117];
                        dVar187 = 0.0;
                        dVar208 = 0.0;
                        if (0.0 <= dVar196 * dVar216) {
                          dVar208 = ABS(dVar196);
                          if (ABS(dVar216) <= ABS(dVar196)) {
                            dVar208 = ABS(dVar216);
                          }
                          dVar208 = dVar208 + dVar208;
                        }
                        dVar186 = pdVar35[lVar111 + lVar168 + ((int)lVar4 - iVar10) * lVar36 +
                                                              lVar117] -
                                  pdVar35[lVar123 + lVar168 + lVar111 + lVar117];
                        dVar219 = pdVar35[lVar123 + lVar168 + lVar111 + lVar117] - dVar185;
                        dVar209 = (dVar219 + dVar186) * 0.5;
                        if (0.0 <= dVar219 * dVar186) {
                          dVar187 = ABS(dVar186);
                          if (ABS(dVar219) <= ABS(dVar186)) {
                            dVar187 = ABS(dVar219);
                          }
                          dVar187 = dVar187 + dVar187;
                        }
                        dVar183 = (dVar196 + dVar219) * 0.5;
                        dVar186 = 0.0;
                        if (0.0 <= dVar196 * dVar219) {
                          dVar186 = ABS(dVar219);
                          if (ABS(dVar196) <= ABS(dVar219)) {
                            dVar186 = ABS(dVar196);
                          }
                          dVar186 = dVar186 + dVar186;
                        }
                        dVar216 = (dVar196 + dVar216) * 0.5;
                        dVar196 = ABS(dVar216);
                        if (dVar208 <= dVar196) {
                          dVar196 = dVar208;
                        }
                        dVar208 = ABS(dVar209);
                        if (dVar187 <= dVar208) {
                          dVar208 = dVar187;
                        }
                        dVar208 = ABS(dVar183 * 1.3333333333333333 +
                                      (dVar208 * (double)((ulong)dVar209 & 0x8000000000000000 |
                                                         0x3ff0000000000000) +
                                      dVar196 * (double)((ulong)dVar216 & 0x8000000000000000 |
                                                        0x3ff0000000000000)) * -0.16666666666666666)
                        ;
                        if (dVar186 <= dVar208) {
                          dVar208 = dVar186;
                        }
                        dVar185 = dVar208 * (double)((ulong)dVar183 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (1.0 - pdVar39[lVar42 + lVar171 + lVar124 + (lVar147 - lVar177)] *
                                         dVar182) * 0.5 + dVar185;
                        auVar190 = _DAT_0077bb30;
                      }
                    }
                  }
                  pdVar47[local_918 * lVar50 +
                          (local_910 - iVar17) * lVar49 +
                          (int)(~uVar16 + iVar137) * lVar48 + (lVar147 - iVar15)] = dVar185;
                  pdVar43[local_918 * lVar46 +
                          (local_910 - iVar129) * lVar45 +
                          (local_900 - iVar14) * lVar44 + (lVar147 - iVar13)] = local_a28;
                  lVar147 = lVar147 + 1;
                  local_738 = local_738 + 1;
                  local_730 = local_730 + 1;
                  local_728 = local_728 + 1;
                  iVar83 = iVar83 + 1;
                  iVar5 = iVar5 + 1;
                  iVar84 = iVar84 + 1;
                } while (iVar28 + 1 != (int)lVar147);
              }
              local_900 = local_900 + 1;
              local_7d8 = local_7d8 + lVar32;
              local_7d0 = local_7d0 + lVar32;
              local_7c8 = local_7c8 + lVar32;
            } while (iVar29 + 1 != (int)local_900);
          }
          local_910 = local_910 + 1;
          local_888 = local_888 + lVar33;
          local_880 = local_880 + lVar33;
          local_878 = local_878 + lVar33;
        } while (iVar30 + 1 != (int)local_910);
      }
      local_918 = local_918 + 1;
    } while (local_918 != 3);
  }
  else {
    local_2d8.q.p = q->p;
    local_2d8.q.jstride = q->jstride;
    local_2d8.q.kstride = q->kstride;
    local_2d8.q.nstride = q->nstride;
    local_2d8.q.begin.x = (q->begin).x;
    local_2d8.q.begin.y = (q->begin).y;
    uVar70 = *(undefined8 *)&(q->begin).z;
    uVar71 = (q->end).y;
    local_2d8.q._52_8_ = *(undefined8 *)&(q->end).z;
    local_2d8.q.begin.z = (int)uVar70;
    local_2d8.q.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.ccvel.p = ccvel->p;
    local_2d8.ccvel.jstride = ccvel->jstride;
    local_2d8.ccvel.kstride = ccvel->kstride;
    local_2d8.ccvel.nstride = ccvel->nstride;
    local_2d8.ccvel.begin.x = (ccvel->begin).x;
    local_2d8.ccvel.begin.y = (ccvel->begin).y;
    uVar72 = (ccvel->end).x;
    uVar73 = (ccvel->end).y;
    local_2d8.ccvel._52_8_ = *(undefined8 *)&(ccvel->end).z;
    local_2d8.ccvel.begin.z = (int)*(undefined8 *)&(ccvel->begin).z;
    local_2d8.Imy.p = Imy->p;
    local_2d8.Imy.jstride = Imy->jstride;
    local_2d8.Imy.kstride = Imy->kstride;
    local_2d8.Imy.nstride = Imy->nstride;
    local_2d8.Imy.begin.x = (Imy->begin).x;
    local_2d8.Imy.begin.y = (Imy->begin).y;
    uVar70 = *(undefined8 *)&(Imy->begin).z;
    uVar74 = (Imy->end).y;
    local_2d8.Imy._52_8_ = *(undefined8 *)&(Imy->end).z;
    local_2d8.Imy.begin.z = (int)uVar70;
    local_2d8.Imy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.Ipy.p = Ipy->p;
    local_2d8.Ipy.jstride = Ipy->jstride;
    local_2d8.Ipy.kstride = Ipy->kstride;
    local_2d8.Ipy.nstride = Ipy->nstride;
    local_2d8.Ipy.begin.x = (Ipy->begin).x;
    local_2d8.Ipy.begin.y = (Ipy->begin).y;
    uVar75 = (Ipy->end).x;
    uVar76 = (Ipy->end).y;
    local_2d8.Ipy._52_8_ = *(undefined8 *)&(Ipy->end).z;
    local_2d8.Ipy.begin.z = (int)*(undefined8 *)&(Ipy->begin).z;
    local_2d8.pbc = pbc;
    local_2d8.flag.p = flag->p;
    local_2d8.flag.jstride = flag->jstride;
    local_2d8.flag.kstride = flag->kstride;
    local_2d8.flag.nstride = flag->nstride;
    local_2d8.flag.begin.x = (flag->begin).x;
    local_2d8.flag.begin.y = (flag->begin).y;
    uVar70 = *(undefined8 *)&(flag->begin).z;
    uVar77 = (flag->end).y;
    local_2d8.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_2d8.flag.begin.z = (int)uVar70;
    local_2d8.flag.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.vfrac.p = vfrac->p;
    local_2d8.vfrac.jstride = vfrac->jstride;
    local_2d8.vfrac.kstride = vfrac->kstride;
    local_2d8.vfrac.nstride = vfrac->nstride;
    local_2d8.vfrac.begin.x = (vfrac->begin).x;
    local_2d8.vfrac.begin.y = (vfrac->begin).y;
    uVar70 = *(undefined8 *)&(vfrac->begin).z;
    uVar78 = (vfrac->end).y;
    local_2d8.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_2d8.vfrac.begin.z = (int)uVar70;
    local_2d8.vfrac.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.ccc.p = ccc->p;
    local_2d8.ccc.jstride = ccc->jstride;
    local_2d8.ccc.kstride = ccc->kstride;
    local_2d8.ccc.nstride = ccc->nstride;
    local_2d8.ccc.begin.x = (ccc->begin).x;
    local_2d8.ccc.begin.y = (ccc->begin).y;
    uVar70 = *(undefined8 *)&(ccc->begin).z;
    uVar79 = (ccc->end).y;
    local_2d8.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_2d8.ccc.begin.z = (int)uVar70;
    local_2d8.ccc.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcx.p = fcx->p;
    local_2d8.fcx.jstride = fcx->jstride;
    local_2d8.fcx.kstride = fcx->kstride;
    local_2d8.fcx.nstride = fcx->nstride;
    local_2d8.fcx.begin.x = (fcx->begin).x;
    local_2d8.fcx.begin.y = (fcx->begin).y;
    uVar70 = *(undefined8 *)&(fcx->begin).z;
    uVar80 = (fcx->end).y;
    local_2d8.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_2d8.fcx.begin.z = (int)uVar70;
    local_2d8.fcx.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcy.p = fcy->p;
    local_2d8.fcy.jstride = fcy->jstride;
    local_2d8.fcy.kstride = fcy->kstride;
    local_2d8.fcy.nstride = fcy->nstride;
    local_2d8.fcy.begin.x = (fcy->begin).x;
    local_2d8.fcy.begin.y = (fcy->begin).y;
    uVar70 = *(undefined8 *)&(fcy->begin).z;
    uVar81 = (fcy->end).y;
    local_2d8.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_2d8.fcy.begin.z = (int)uVar70;
    local_2d8.fcy.end.x = (int)((ulong)uVar70 >> 0x20);
    local_2d8.fcz.p = fcz->p;
    local_2d8.fcz.jstride = fcz->jstride;
    local_2d8.fcz.kstride = fcz->kstride;
    local_2d8.fcz.nstride = fcz->nstride;
    local_2d8.fcz.begin.x = (fcz->begin).x;
    local_2d8.fcz.begin.y = (fcz->begin).y;
    uVar70 = *(undefined8 *)&(fcz->begin).z;
    uVar82 = (fcz->end).y;
    local_2d8.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_2d8.fcz.begin.z = (int)uVar70;
    local_2d8.fcz.end.x = (int)((ulong)uVar70 >> 0x20);
    iVar9 = (yebox->smallend).vect[0];
    iVar10 = (yebox->smallend).vect[1];
    iVar11 = (yebox->smallend).vect[2];
    iVar12 = (yebox->bigend).vect[0];
    iVar13 = (yebox->bigend).vect[1];
    iVar14 = (yebox->bigend).vect[2];
    iVar129 = 0;
    local_2d8.q.end.y = uVar71;
    local_2d8.ccvel.end.x = uVar72;
    local_2d8.ccvel.end.y = uVar73;
    local_2d8.domain_ilo = iVar172;
    local_2d8.domain_jlo = iVar175;
    local_2d8.domain_klo = iVar7;
    local_2d8.domain_ihi = iVar161;
    local_2d8.domain_jhi = iVar6;
    local_2d8.domain_khi = iVar8;
    local_2d8.Imy.end.y = uVar74;
    local_2d8.Ipy.end.x = uVar75;
    local_2d8.Ipy.end.y = uVar76;
    local_2d8.dtdy = dVar182;
    local_2d8.flag.end.y = uVar77;
    local_2d8.vfrac.end.y = uVar78;
    local_2d8.ccc.end.y = uVar79;
    local_2d8.fcx.end.y = uVar80;
    local_2d8.fcy.end.y = uVar81;
    local_2d8.fcz.end.y = uVar82;
    do {
      iVar172 = iVar11;
      if (iVar11 <= iVar14) {
        do {
          iVar175 = iVar10;
          if (iVar10 <= iVar13) {
            do {
              iVar161 = iVar9;
              if (iVar9 <= iVar12) {
                do {
                  PredictVelOnYFace::anon_class_680_18_513cbdb0::operator()
                            (&local_2d8,iVar161,iVar175,iVar172,iVar129);
                  iVar161 = iVar161 + 1;
                } while (iVar12 + 1 != iVar161);
              }
              bVar180 = iVar175 != iVar13;
              iVar175 = iVar175 + 1;
            } while (bVar180);
          }
          bVar180 = iVar172 != iVar14;
          iVar172 = iVar172 + 1;
        } while (bVar180);
      }
      iVar129 = iVar129 + 1;
    } while (iVar129 != 3);
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnYFace (Box const& yebox,
                          Array4<Real> const& Imy, Array4<Real> const& Ipy,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;
    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                 Real delta_x =  xf  - ccc(i,j,k,0);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                 Real delta_x = xf  - ccc(i,j-1,k,0);,
                                 Real delta_z = zf  - ccc(i,j-1,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}